

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.h
# Opt level: O1

string * __thiscall cmGlobalKdevelopGenerator::GetName_abi_cxx11_(cmGlobalKdevelopGenerator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x706f6c657665444b;
  *(undefined2 *)((long)&in_RDI->field_2 + 8) = 0x33;
  in_RDI->_M_string_length = 9;
  return in_RDI;
}

Assistant:

virtual std::string GetName() const
                          { return cmGlobalKdevelopGenerator::GetActualName();}